

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O2

ValueLength arangodb::velocypack::Collection::indexOf(Slice slice,Slice other)

{
  bool bVar1;
  ValueLength VVar2;
  uint8_t *local_58;
  Slice other_local;
  ArrayIterator it;
  
  other_local = other;
  ArrayIterator::ArrayIterator(&it,slice);
  VVar2 = 0;
  while( true ) {
    if (it._position == it._size) {
      return 0xffffffffffffffff;
    }
    local_58 = (uint8_t *)ArrayIterator::value(&it);
    bVar1 = SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
            binaryEquals<arangodb::velocypack::Slice,arangodb::velocypack::Slice>
                      ((SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)
                       &local_58,
                       (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &other_local);
    if (bVar1) break;
    ArrayIterator::next(&it);
    VVar2 = VVar2 + 1;
  }
  return VVar2;
}

Assistant:

ValueLength Collection::indexOf(Slice slice, Slice other) {
  ArrayIterator it(slice);
  ValueLength index = 0;

  while (it.valid()) {
    if (it.value().binaryEquals(other)) {
      return index;
    }
    it.next();
    ++index;
  }

  return Collection::NotFound;
}